

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::ShapeSceneEntity::~ShapeSceneEntity(ShapeSceneEntity *this)

{
  std::__cxx11::string::~string((string *)&this->outsideMedium);
  std::__cxx11::string::~string((string *)&this->insideMedium);
  std::__cxx11::string::~string((string *)&this->materialName);
  SceneEntity::~SceneEntity(&this->super_SceneEntity);
  return;
}

Assistant:

ShapeSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const Transform *renderFromObject, const Transform *objectFromRender,
                     bool reverseOrientation, int materialIndex,
                     const std::string &materialName, int lightIndex,
                     const std::string &insideMedium, const std::string &outsideMedium)
        : SceneEntity(name, parameters, loc),
          renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}